

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int lua_getinfo(lua_State *L,char *what,lua_Debug *ar)

{
  byte bVar1;
  GCObject *pGVar2;
  int iVar3;
  TValue *i_o;
  char *pcVar4;
  GCObject *t;
  TValue *pTVar5;
  StkId pTVar6;
  char *extraout_RAX;
  byte *pbVar7;
  GCObject *pGVar8;
  CallInfo *ci;
  long lVar9;
  
  if (*what == '>') {
    what = what + 1;
    pGVar8 = L->top[-1].value.gc;
    L->top = L->top + -1;
    ci = (CallInfo *)0x0;
  }
  else if ((long)ar->i_ci == 0) {
    ci = (CallInfo *)0x0;
    pGVar8 = (GCObject *)0x0;
  }
  else {
    ci = L->base_ci + ar->i_ci;
    pGVar8 = (ci->func->value).gc;
  }
  if (pGVar8 == (GCObject *)0x0) {
    ar->namewhat = "";
    ar->name = "";
    ar->what = "tail";
    ar->currentline = -1;
    ar->linedefined = -1;
    ar->lastlinedefined = -1;
    ar->source = "=(tail call)";
    luaO_chunkid(ar->short_src,"=(tail call)",0x3c);
    ar->nups = 0;
LAB_0010a726:
    pcVar4 = strchr(what,0x66);
    if (pcVar4 != (char *)0x0) {
      pTVar6 = L->top;
      if (pGVar8 == (GCObject *)0x0) {
        iVar3 = 0;
      }
      else {
        (pTVar6->value).gc = pGVar8;
        iVar3 = 6;
      }
      pTVar6->tt = iVar3;
      if ((long)L->stack_last - (long)L->top < 0x11) {
        luaD_growstack(L,1);
      }
      L->top = L->top + 1;
    }
    pcVar4 = strchr(what,0x4c);
    if (pcVar4 != (char *)0x0) {
      if ((pGVar8 == (GCObject *)0x0) || ((pGVar8->h).flags != '\0')) {
        pTVar6 = L->top;
        iVar3 = 0;
      }
      else {
        t = (GCObject *)luaH_new(L,0,0);
        if (0 < *(int *)((long)&((pGVar8->th).l_G)->tmudata + 4)) {
          pGVar2 = ((pGVar8->th).l_G)->rootgc;
          lVar9 = 0;
          do {
            pTVar5 = luaH_setnum(L,&t->h,*(int *)((long)pGVar2 + lVar9 * 4));
            (pTVar5->value).b = 1;
            pTVar5->tt = 1;
            lVar9 = lVar9 + 1;
          } while (lVar9 < *(int *)((long)&((pGVar8->th).l_G)->tmudata + 4));
        }
        pTVar6 = L->top;
        (pTVar6->value).gc = t;
        iVar3 = 5;
      }
      pTVar6->tt = iVar3;
      pcVar4 = (char *)((long)L->stack_last - (long)L->top);
      if ((long)pcVar4 < 0x11) {
        luaD_growstack(L,1);
        pcVar4 = extraout_RAX;
      }
      L->top = L->top + 1;
    }
    return (int)pcVar4;
  }
  pbVar7 = (byte *)what;
  do {
    bVar1 = *pbVar7;
    if (bVar1 < 0x6e) {
      if (bVar1 == 0x53) {
        if ((pGVar8->h).flags == '\0') {
          ar->source = (char *)&(((pGVar8->th).l_G)->grayagain->h).array;
          iVar3 = (int)(((pGVar8->th).l_G)->buff).n;
          ar->linedefined = iVar3;
          ar->lastlinedefined = *(int *)((long)&(((pGVar8->th).l_G)->buff).n + 4);
          pcVar4 = "Lua";
          if (iVar3 == 0) {
            pcVar4 = "main";
          }
        }
        else {
          ar->source = "=[C]";
          ar->linedefined = -1;
          ar->lastlinedefined = -1;
          pcVar4 = "C";
        }
        ar->what = pcVar4;
        luaO_chunkid(ar->short_src,ar->source,0x3c);
      }
      else if (bVar1 == 0x6c) {
        if (ci == (CallInfo *)0x0) {
          iVar3 = -1;
        }
        else {
          iVar3 = currentline(L,ci);
        }
        ar->currentline = iVar3;
      }
      else if (bVar1 == 0) goto LAB_0010a726;
    }
    else if (bVar1 == 0x6e) {
      ar->namewhat = "";
      ar->name = (char *)0x0;
    }
    else if (bVar1 == 0x75) {
      ar->nups = (uint)(pGVar8->h).lsizenode;
    }
    pbVar7 = pbVar7 + 1;
  } while( true );
}

Assistant:

static int lua_getinfo(lua_State*L,const char*what,lua_Debug*ar){
int status;
Closure*f=NULL;
CallInfo*ci=NULL;
if(*what=='>'){
StkId func=L->top-1;
luai_apicheck(L,ttisfunction(func));
what++;
f=clvalue(func);
L->top--;
}
else if(ar->i_ci!=0){
ci=L->base_ci+ar->i_ci;
f=clvalue(ci->func);
}
status=auxgetinfo(L,what,ar,f,ci);
if(strchr(what,'f')){
if(f==NULL)setnilvalue(L->top);
else setclvalue(L,L->top,f);
incr_top(L);
}
if(strchr(what,'L'))
collectvalidlines(L,f);
return status;
}